

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

void buildXDBsortedAtomRecs(xformDatabase *xdb)

{
  int iVar1;
  transformdata_t *ptVar2;
  xformAtomRecords **__base;
  xformAtomRecords *pxVar3;
  xformAtomRecords **ppxVar4;
  int iVar5;
  ulong __nmemb;
  transformData *ptVar6;
  
  if (xdb == (xformDatabase *)0x0) {
    return;
  }
  ptVar6 = xdb->xforms;
  if (ptVar6 == (transformData *)0x0) {
    __base = (xformAtomRecords **)malloc(8);
    if (__base != (xformAtomRecords **)0x0) {
      __nmemb = 0;
      goto LAB_00121033;
    }
  }
  else {
    iVar5 = 0;
    ptVar2 = ptVar6;
    do {
      pxVar3 = (xformAtomRecords *)&ptVar2->recs;
      iVar1 = iVar5;
      do {
        iVar5 = iVar1;
        pxVar3 = pxVar3->next;
        iVar1 = iVar5 + 1;
      } while (pxVar3 != (xformAtomRecords *)0x0);
      ptVar2 = ptVar2->next;
    } while (ptVar2 != (transformdata_t *)0x0);
    __base = (xformAtomRecords **)malloc((long)(iVar5 + 1) << 3);
    if (__base != (xformAtomRecords **)0x0) {
      __nmemb = 0;
      if (ptVar6 != (transformData *)0x0) {
        do {
          pxVar3 = ptVar6->recs;
          if (pxVar3 != (xformAtomRecords *)0x0) {
            ppxVar4 = __base + (int)__nmemb;
            do {
              *ppxVar4 = pxVar3;
              pxVar3 = pxVar3->next;
              ppxVar4 = ppxVar4 + 1;
              __nmemb = (ulong)((int)__nmemb + 1);
            } while (pxVar3 != (xformAtomRecords_t *)0x0);
          }
          ptVar6 = ptVar6->next;
        } while (ptVar6 != (transformdata_t *)0x0);
        __nmemb = (ulong)(int)__nmemb;
      }
LAB_00121033:
      __base[__nmemb] = (xformAtomRecords *)0x0;
      qsort(__base,__nmemb,8,compareXDBAtomRecs);
      goto LAB_00121060;
    }
  }
  errmsg("could not create atom sorted-order array");
  __base = (xformAtomRecords **)0x0;
LAB_00121060:
  xdb->sortedByRes = __base;
  return;
}

Assistant:

void buildXDBsortedAtomRecs(xformDatabase* xdb) {
   transformData *xform = NULL;
   xformAtomRecords *xa = NULL;
   xformAtomRecords **srtvec = NULL;
   int n = 0;

   if (xdb) {
      n = 0; /* first count the number of atoms */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    n++;
	 }
      }

      /* build an array with extra room for a terminating null pointer */
      srtvec = (xformAtomRecords**)malloc((n + 1)*sizeof(xformAtomRecords*));
      if (!srtvec) {
	 errmsg("could not create atom sorted-order array");
	 xdb->sortedByRes = NULL;
	 return;
      }

      n = 0; /* now we store pointers to the AtomRecs in the array */
      for (xform = xdb->xforms; xform; xform = xform->next) {
	 for(xa = xform->recs; xa; xa = xa->next) {
	    srtvec[n] = xa;
	    n++;
	 }
      }
      srtvec[n] = NULL; /* array ends with a NULL */

      qsort(&(srtvec[0]), n, sizeof(xformAtomRecords*), compareXDBAtomRecs);

      xdb->sortedByRes = srtvec; /* stash away the sorted array */
   }
}